

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::
write_padded<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::str_writer<char>>
          (basic_writer<fmt::v6::buffer_range<char>> *this,format_specs *specs,str_writer<char> *f)

{
  byte bVar1;
  size_t sVar2;
  byte bVar3;
  checked_ptr<typename_buffer<char>::value_type> pcVar4;
  size_t sVar5;
  size_t __len;
  size_t __n;
  char __tmp;
  char *__src;
  size_t __len_1;
  ulong uVar6;
  ptrdiff_t _Num_2;
  checked_ptr<typename_buffer<char>::value_type> __dest;
  
  uVar6 = (ulong)(uint)specs->width;
  sVar5 = f->size_;
  __n = uVar6 - sVar5;
  if (uVar6 < sVar5 || __n == 0) {
    pcVar4 = reserve<fmt::v6::internal::buffer<char>,_0>
                       ((back_insert_iterator<fmt::v6::internal::buffer<char>_> *)this,sVar5);
    sVar5 = f->size_;
    if (sVar5 == 0) {
      return;
    }
    __src = f->s;
LAB_0013093d:
    memmove(pcVar4,__src,sVar5);
    return;
  }
  pcVar4 = reserve<fmt::v6::internal::buffer<char>,_0>
                     ((back_insert_iterator<fmt::v6::internal::buffer<char>_> *)this,uVar6);
  bVar1 = (specs->fill).data_[0];
  bVar3 = specs->field_0x9 & 0xf;
  if (bVar3 == 3) {
    uVar6 = __n >> 1;
    __dest = pcVar4;
    if (1 < __n) {
      __dest = pcVar4 + uVar6;
      memset(pcVar4,(uint)bVar1,uVar6);
    }
    sVar2 = f->size_;
    if (sVar2 != 0) {
      memmove(__dest,f->s,sVar2);
    }
    __n = __n - uVar6;
    pcVar4 = __dest + sVar2;
  }
  else {
    if (bVar3 == 2) {
      memset(pcVar4,(uint)bVar1,__n);
      sVar5 = f->size_;
      if (sVar5 == 0) {
        return;
      }
      pcVar4 = pcVar4 + __n;
      __src = f->s;
      goto LAB_0013093d;
    }
    sVar2 = f->size_;
    if (sVar2 != 0) {
      memmove(pcVar4,f->s,sVar2);
    }
    pcVar4 = pcVar4 + sVar2;
  }
  memset(pcVar4,(uint)bVar1,__n);
  return;
}

Assistant:

void write_padded(const format_specs& specs, F&& f) {
    // User-perceived width (in code points).
    unsigned width = to_unsigned(specs.width);
    size_t size = f.size();  // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points) return f(reserve(size));
    auto&& it = reserve(width + (size - num_code_points));
    char_type fill = specs.fill[0];
    std::size_t padding = width - num_code_points;
    if (specs.align == align::right) {
      it = std::fill_n(it, padding, fill);
      f(it);
    } else if (specs.align == align::center) {
      std::size_t left_padding = padding / 2;
      it = std::fill_n(it, left_padding, fill);
      f(it);
      it = std::fill_n(it, padding - left_padding, fill);
    } else {
      f(it);
      it = std::fill_n(it, padding, fill);
    }
  }